

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O0

void deqp::gles3::Functional::FboTestUtil::readPixels
               (Context *ctx,Surface *dst,int x,int y,int width,int height,TextureFormat *format,
               Vec4 *scale,Vec4 *bias)

{
  int iVar1;
  TransferFormat TVar2;
  reference pvVar3;
  undefined1 local_108 [16];
  Vector<float,_4> local_f8;
  Vec4 local_e8;
  int local_d8;
  int local_d4;
  int xo;
  int yo;
  PixelBufferAccess dstAccess;
  ConstPixelBufferAccess src;
  allocator<unsigned_char> local_69;
  undefined1 local_68 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  int rowSize;
  int alignment;
  deUint32 dStack_3c;
  TransferFormat transferFmt;
  TextureFormat readFormat;
  int height_local;
  int width_local;
  int y_local;
  int x_local;
  Surface *dst_local;
  Context *ctx_local;
  
  transferFmt = (TransferFormat)getFramebufferReadFormat(format);
  TVar2 = glu::getTransferFormat((TextureFormat)transferFmt);
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 4;
  iVar1 = tcu::TextureFormat::getPixelSize((TextureFormat *)&transferFmt);
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ =
       deAlign32(iVar1 * width,
                 data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_);
  iVar1 = (deInt32)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage * height;
  std::allocator<unsigned_char>::allocator(&local_69);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68,(long)iVar1,&local_69
            );
  std::allocator<unsigned_char>::~allocator(&local_69);
  dStack_3c = TVar2.dataType;
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68,0);
  (*ctx->_vptr_Context[0x78])
            (ctx,(ulong)(uint)x,(ulong)(uint)y,(ulong)(uint)width,(ulong)(uint)height,
             (ulong)TVar2 & 0xffffffff,dStack_3c,pvVar3);
  iVar1 = (deInt32)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68,0);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)&dstAccess.super_ConstPixelBufferAccess.m_data,
             (TextureFormat *)&transferFmt,width,height,1,iVar1,0,pvVar3);
  tcu::Surface::setSize(dst,width,height);
  tcu::Surface::getAccess((PixelBufferAccess *)&xo,dst);
  for (local_d4 = 0; local_d4 < height; local_d4 = local_d4 + 1) {
    for (local_d8 = 0; local_d8 < width; local_d8 = local_d8 + 1) {
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)local_108,(int)&dstAccess + 0x20,local_d8,local_d4);
      tcu::operator*((tcu *)&local_f8,(Vector<float,_4> *)local_108,scale);
      tcu::operator+((tcu *)&local_e8,&local_f8,bias);
      tcu::PixelBufferAccess::setPixel((PixelBufferAccess *)&xo,&local_e8,local_d8,local_d4,0);
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68);
  return;
}

Assistant:

void readPixels (sglr::Context& ctx, tcu::Surface& dst, int x, int y, int width, int height, const tcu::TextureFormat& format, const tcu::Vec4& scale, const tcu::Vec4& bias)
{
	tcu::TextureFormat		readFormat		= getFramebufferReadFormat(format);
	glu::TransferFormat		transferFmt		= glu::getTransferFormat(readFormat);
	int						alignment		= 4; // \note GL_PACK_ALIGNMENT = 4 is assumed.
	int						rowSize			= deAlign32(readFormat.getPixelSize()*width, alignment);
	vector<deUint8>			data			(rowSize*height);

	ctx.readPixels(x, y, width, height, transferFmt.format, transferFmt.dataType, &data[0]);

	// Convert to surface.
	tcu::ConstPixelBufferAccess src(readFormat, width, height, 1, rowSize, 0, &data[0]);

	dst.setSize(width, height);
	tcu::PixelBufferAccess dstAccess = dst.getAccess();

	for (int yo = 0; yo < height; yo++)
	for (int xo = 0; xo < width; xo++)
		dstAccess.setPixel(src.getPixel(xo, yo) * scale + bias, xo, yo);
}